

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::UDFWrapper::
CreateUnaryAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t>
          (AggregateFunction *__return_storage_ptr__,UDFWrapper *this,string *name,
          LogicalType *ret_type,LogicalType *input_type)

{
  FunctionNullHandling null_handling;
  LogicalType aLStack_38 [24];
  
  null_handling = (FunctionNullHandling)input_type;
  duckdb::LogicalType::LogicalType(aLStack_38,(LogicalType *)name);
  AggregateFunction::
  UnaryAggregate<duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t,duckdb::UDFAverageFunction,(duckdb::AggregateDestructorType)0>
            (__return_storage_ptr__,(AggregateFunction *)ret_type,aLStack_38,(LogicalType *)0x0,
             null_handling);
  duckdb::LogicalType::~LogicalType(aLStack_38);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->field_0x8);
  return __return_storage_ptr__;
}

Assistant:

inline static AggregateFunction CreateUnaryAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                             const LogicalType &input_type) {
		AggregateFunction aggr_function =
		    AggregateFunction::UnaryAggregate<STATE, TR, TA, UDF_OP>(input_type, ret_type);
		aggr_function.name = name;
		return aggr_function;
	}